

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_spatial.cpp
# Opt level: O1

void __thiscall
embree::sse2::
BVHNBuilderFastSpatialSAH<4,_embree::TriangleMesh,_embree::TriangleMv<4>,_embree::sse2::TriangleSplitterFactory>
::build(BVHNBuilderFastSpatialSAH<4,_embree::TriangleMesh,_embree::TriangleMv<4>,_embree::sse2::TriangleSplitterFactory>
        *this)

{
  mvector<PrimRef> *prims;
  undefined8 *puVar1;
  undefined8 *puVar2;
  char cVar3;
  BVH *pBVar4;
  pointer ppTVar5;
  Device *pDVar6;
  Block *pBVar7;
  PrimRef *pPVar8;
  MemoryMonitorInterface *pMVar9;
  TriangleMesh *pTVar10;
  Geometry *pGVar11;
  BVHN<4> *this_00;
  Scene *pSVar12;
  double dVar13;
  undefined8 uVar14;
  long lVar15;
  long *plVar16;
  ulong uVar17;
  PrimRef *pPVar18;
  size_t sVar19;
  NodeRef root;
  long *plVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  EVP_PKEY_CTX *ctx;
  uint uVar25;
  __pointer_type pBVar26;
  size_t sVar27;
  uint uVar28;
  pointer ppTVar29;
  size_t *psVar30;
  bool bVar31;
  float fVar32;
  PrimInfo pinfo;
  string __str;
  BuildProgressMonitor *in_stack_fffffffffffffe68;
  BuildProgressMonitor *in_stack_fffffffffffffe70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  size_t local_f8;
  size_t sStack_f0;
  size_t *local_e8;
  double local_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  size_t local_58;
  size_t sStack_50;
  undefined **local_40;
  Scene *local_38;
  
  if ((this->mesh != (TriangleMesh *)0x0) &&
     ((this->mesh->super_Geometry).numPrimitives != this->numPreviousPrimitives)) {
    pBVar4 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar4->alloc);
    ppTVar5 = (pBVar4->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar29 = (pBVar4->alloc).thread_local_allocators.
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar29 != ppTVar5;
        ppTVar29 = ppTVar29 + 1) {
      FastAllocator::ThreadLocal2::unbind(*ppTVar29,&pBVar4->alloc);
    }
    ppTVar29 = (pBVar4->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar4->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar29) {
      (pBVar4->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar29;
    }
    LOCK();
    (pBVar4->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar4->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar4->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar4->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar6 = (pBVar4->alloc).device;
      bVar31 = (pBVar4->alloc).useUSM;
      pBVar26 = (pBVar4->alloc).usedBlocks._M_b._M_p;
      do {
        pBVar7 = pBVar26->next;
        FastAllocator::Block::clear_block(pBVar26,pDVar6,bVar31);
        pBVar26 = pBVar7;
      } while (pBVar7 != (Block *)0x0);
    }
    LOCK();
    (pBVar4->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar4->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar6 = (pBVar4->alloc).device;
      bVar31 = (pBVar4->alloc).useUSM;
      pBVar26 = (pBVar4->alloc).freeBlocks._M_b._M_p;
      do {
        pBVar7 = pBVar26->next;
        FastAllocator::Block::clear_block(pBVar26,pDVar6,bVar31);
        pBVar26 = pBVar7;
      } while (pBVar7 != (Block *)0x0);
    }
    LOCK();
    (pBVar4->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar15 = -8;
    do {
      LOCK();
      (pBVar4->alloc).threadBlocks[lVar15]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      LOCK();
      (pBVar4->alloc).threadBlocks[lVar15 + 8]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0);
    sVar19 = (pBVar4->alloc).primrefarray.size_alloced;
    pPVar8 = (pBVar4->alloc).primrefarray.items;
    if (pPVar8 != (PrimRef *)0x0) {
      if (sVar19 << 5 < 0x1c00000) {
        alignedFree(pPVar8);
      }
      else {
        os_free(pPVar8,sVar19 << 5,(pBVar4->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar19 != 0) {
      pMVar9 = (pBVar4->alloc).primrefarray.alloc.device;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar19 * -0x20,1);
    }
    (pBVar4->alloc).primrefarray.size_active = 0;
    (pBVar4->alloc).primrefarray.size_alloced = 0;
    (pBVar4->alloc).primrefarray.items = (PrimRef *)0x0;
  }
  pTVar10 = this->mesh;
  if (pTVar10 == (TriangleMesh *)0x0) {
    sVar19 = (this->scene->world).numTriangles;
  }
  else {
    sVar19 = (size_t)(pTVar10->super_Geometry).numPrimitives;
  }
  this->numPreviousPrimitives = (uint)sVar19;
  if (sVar19 != 0) {
    if (pTVar10 == (TriangleMesh *)0x0) {
      sVar27 = (this->scene->geometries).size_active;
      if (sVar27 == 0) {
        uVar28 = 0;
      }
      else {
        uVar28 = 0;
        sVar22 = 0;
        do {
          pGVar11 = (this->scene->geometries).items[sVar22].ptr;
          bVar31 = true;
          if (((pGVar11 != (Geometry *)0x0) && (((pGVar11->field_8).field_0x2 & 0x20) != 0)) &&
             (*(char *)&pGVar11->field_8 == '\x14')) {
            bVar31 = pGVar11->numTimeSteps != 1;
          }
          uVar25 = uVar28;
          if (uVar28 <= (uint)sVar22) {
            uVar25 = (uint)sVar22;
          }
          if (!bVar31) {
            uVar28 = uVar25;
          }
          sVar22 = sVar22 + 1;
        } while (sVar27 != sVar22);
      }
    }
    else {
      uVar28 = this->geomID_;
    }
    this_00 = this->bvh;
    cVar3 = *(char *)(*(long *)&(this->scene->super_AccelN).field_0x188 + 0x464);
    if (pTVar10 == (TriangleMesh *)0x0) {
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct((ulong)local_b8,'\x01');
      *local_b8[0] = 0x34;
      plVar16 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x1ffdf3e);
      local_d8 = &local_c8;
      plVar20 = plVar16 + 2;
      if ((long *)*plVar16 == plVar20) {
        local_c8 = *plVar20;
        lStack_c0 = plVar16[3];
      }
      else {
        local_c8 = *plVar20;
        local_d8 = (long *)*plVar16;
      }
      local_d0 = plVar16[1];
      *plVar16 = (long)plVar20;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_138._0_8_ = &local_128;
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 == paVar21) {
        local_128._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_128._8_8_ = plVar16[3];
      }
      else {
        local_128._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_138._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar16;
      }
      local_138._8_8_ = plVar16[1];
      *plVar16 = (long)paVar21;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
    }
    else {
      local_138._0_8_ = &local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
    }
    local_e0 = BVHN<4>::preBuild(this_00,(string *)&local_138.field_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._0_8_ != &local_128) {
      operator_delete((void *)local_138._0_8_);
    }
    if (pTVar10 == (TriangleMesh *)0x0) {
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
    }
    fVar32 = (float)sVar19 * this->splitFactor;
    uVar17 = (ulong)fVar32;
    uVar17 = (long)(fVar32 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17;
    if (uVar17 < sVar19) {
      uVar17 = sVar19;
    }
    uVar23 = (this->prims0).size_alloced;
    uVar24 = uVar23;
    if ((uVar23 < uVar17) && (uVar24 = uVar17, uVar23 != 0)) {
      for (; uVar24 = uVar23, uVar23 < uVar17; uVar23 = uVar23 * 2 + (ulong)(uVar23 * 2 == 0)) {
      }
    }
    psVar30 = &(this->prims0).size_active;
    if (uVar17 < (this->prims0).size_active) {
      *psVar30 = uVar17;
    }
    prims = &this->prims0;
    if ((this->prims0).size_alloced == uVar24) {
      *psVar30 = uVar17;
    }
    else {
      pPVar8 = (this->prims0).items;
      local_e8 = psVar30;
      if (uVar24 != 0) {
        pMVar9 = (prims->alloc).device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar24 << 5,0);
      }
      sVar27 = uVar24 << 5;
      if (sVar27 < 0x1c00000) {
        pPVar18 = (PrimRef *)alignedMalloc(sVar27,0x20);
      }
      else {
        pPVar18 = (PrimRef *)os_malloc(sVar27,&(this->prims0).alloc.hugepages);
      }
      (this->prims0).items = pPVar18;
      if ((this->prims0).size_active != 0) {
        lVar15 = 0x10;
        uVar23 = 0;
        do {
          pPVar18 = (this->prims0).items;
          puVar1 = (undefined8 *)((long)pPVar8 + lVar15 + -0x10);
          uVar14 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar18 + lVar15 + -0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar14;
          puVar2 = (undefined8 *)((long)&(pPVar8->lower).field_0 + lVar15);
          uVar14 = puVar2[1];
          puVar1 = (undefined8 *)((long)&(pPVar18->lower).field_0 + lVar15);
          *puVar1 = *puVar2;
          puVar1[1] = uVar14;
          uVar23 = uVar23 + 1;
          lVar15 = lVar15 + 0x20;
        } while (uVar23 < (this->prims0).size_active);
      }
      sVar27 = (this->prims0).size_alloced;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar27 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar27 << 5,(this->prims0).alloc.hugepages);
        }
      }
      if (sVar27 != 0) {
        pMVar9 = (prims->alloc).device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar27 * -0x20,1);
      }
      (this->prims0).size_active = uVar17;
      (this->prims0).size_alloced = uVar24;
      psVar30 = local_e8;
    }
    if (this->mesh != (TriangleMesh *)0x0) {
      (this->bvh->alloc).atype = EMBREE_OS_MALLOC;
    }
    if (uVar28 < 0x8000000 && cVar3 == '\0') {
      if (this->mesh == (TriangleMesh *)0x0) {
        sse2::createPrimRefArray
                  ((PrimInfo *)&local_98,this->scene,MTY_TRIANGLE_MESH,false,uVar17,prims,
                   &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
      }
      else {
        sse2::createPrimRefArray
                  ((PrimInfo *)&local_98,&this->mesh->super_Geometry,this->geomID_,uVar17,prims,
                   &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
      }
      local_138._0_8_ = local_98._0_8_;
      local_138._8_8_ = local_98._8_8_;
      local_128._M_allocated_capacity = local_88._0_8_;
      local_128._8_8_ = local_88._8_8_;
      local_118 = local_78._0_8_;
      uStack_110 = local_78._8_8_;
      local_108 = local_68._0_8_;
      uStack_100 = local_68._8_8_;
      local_f8 = local_58;
      sStack_f0 = sStack_50;
      pSVar12 = this->scene;
      dVar13 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 176.0;
      uVar23 = (ulong)dVar13;
      sVar19 = ((long)(dVar13 - 9.223372036854776e+18) & (long)uVar23 >> 0x3f | uVar23) +
               (sStack_50 - local_58 & 0x1ffffffffffffff) * 8;
      FastAllocator::init_estimate(&this->bvh->alloc,sVar19);
      sVar19 = FastAllocator::fixSingleThreadThreshold
                         (&this->bvh->alloc,4,0x400,sStack_f0 - local_f8,sVar19);
      (this->settings).singleThreadThreshold = sVar19;
      (this->settings).branchingFactor = 4;
      (this->settings).maxDepth = 0x28;
      local_98._0_8_ = this->bvh;
      local_40 = &PTR_operator___02202970;
      local_38 = (((BVH *)local_98._0_8_)->scene->progressInterface).scene;
      root.ptr = (size_t)BVHBuilderBinnedFastSpatialSAH::
                         build<embree::NodeRefPtr<4>,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>,embree::sse2::TriangleSplitterFactory,embree::Scene::BuildProgressMonitorInterface>
                                   (&((BVH *)local_98._0_8_)->alloc,&local_98,pSVar12,&local_40,
                                    (this->prims0).items,uVar17,&local_138,&this->settings);
    }
    else {
      if (this->mesh == (TriangleMesh *)0x0) {
        createPrimRefArray_presplit<embree::TriangleMesh,embree::sse2::TriangleSplitterFactory>
                  ((PrimInfo *)&local_98,(sse2 *)this->scene,(Scene *)&Geometry::updateBuffer,
                   ~MTY_ALL,SUB81(sVar19,0),(size_t)prims,
                   (mvector<PrimRef> *)&this->bvh->scene->progressInterface,
                   in_stack_fffffffffffffe70);
      }
      else {
        createPrimRefArray_presplit<embree::TriangleMesh,embree::sse2::TriangleSplitterFactory>
                  ((PrimInfo *)&local_98,(sse2 *)this->mesh,(Geometry *)(ulong)uVar28,(uint)sVar19,
                   (size_t)prims,(mvector<PrimRef> *)&this->bvh->scene->progressInterface,
                   in_stack_fffffffffffffe68);
      }
      local_138._0_8_ = local_98._0_8_;
      local_138._8_8_ = local_98._8_8_;
      local_128._M_allocated_capacity = local_88._0_8_;
      local_128._8_8_ = local_88._8_8_;
      local_118 = local_78._0_8_;
      uStack_110 = local_78._8_8_;
      local_108 = local_68._0_8_;
      uStack_100 = local_68._8_8_;
      local_f8 = local_58;
      sStack_f0 = sStack_50;
      dVar13 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 176.0;
      uVar17 = (ulong)dVar13;
      sVar19 = ((long)(dVar13 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17) +
               (sStack_50 - local_58 & 0x1ffffffffffffff) * 8;
      FastAllocator::init_estimate(&this->bvh->alloc,sVar19);
      sVar19 = FastAllocator::fixSingleThreadThreshold
                         (&this->bvh->alloc,4,0x400,sStack_f0 - local_f8,sVar19);
      (this->settings).singleThreadThreshold = sVar19;
      (this->settings).branchingFactor = 4;
      (this->settings).maxDepth = 0x28;
      local_98._8_8_ = this->bvh;
      local_98._0_8_ = &PTR_createLeaf_0220a700;
      root.ptr = (size_t)BVHNBuilderVirtual<4>::BVHNBuilderV::build
                                   ((BVHNBuilderV *)&local_98,&((BVH *)local_98._8_8_)->alloc,
                                    &(((BVH *)local_98._8_8_)->scene->progressInterface).
                                     super_BuildProgressMonitor,(this->prims0).items,
                                    (PrimInfo *)&local_138.field_1,this->settings);
    }
    local_98._0_8_ = local_138._0_8_;
    local_98._8_8_ = local_138._8_8_;
    local_88._0_8_ = local_128._M_allocated_capacity;
    local_88._8_8_ = local_128._8_8_;
    local_78._0_8_ = local_138._0_8_;
    local_78._8_8_ = local_138._8_8_;
    local_68._0_8_ = local_128._M_allocated_capacity;
    local_68._8_8_ = local_128._8_8_;
    BVHN<4>::set(this->bvh,root,(LBBox3fa *)&local_98,sStack_f0 - local_f8);
    fVar32 = (float)(sStack_f0 - local_f8) * 0.005;
    uVar17 = (ulong)fVar32;
    ctx = (EVP_PKEY_CTX *)((long)(fVar32 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17);
    BVHN<4>::layoutLargeNodes(this->bvh,(size_t)ctx);
    if ((this->scene != (Scene *)0x0) &&
       ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
      sVar19 = (this->prims0).size_alloced;
      pPVar8 = (this->prims0).items;
      if (pPVar8 != (PrimRef *)0x0) {
        ctx = (EVP_PKEY_CTX *)(sVar19 << 5);
        if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,(size_t)ctx,(this->prims0).alloc.hugepages);
        }
      }
      if (sVar19 != 0) {
        pMVar9 = (prims->alloc).device;
        ctx = (EVP_PKEY_CTX *)(sVar19 * -0x20);
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,ctx,1);
      }
      *psVar30 = 0;
      psVar30[1] = 0;
      psVar30[2] = 0;
    }
    BVHN<4>::cleanup(this->bvh,ctx);
    BVHN<4>::postBuild(this->bvh,local_e0);
    return;
  }
  sVar19 = (this->prims0).size_alloced;
  pPVar8 = (this->prims0).items;
  if (pPVar8 != (PrimRef *)0x0) {
    if (sVar19 << 5 < 0x1c00000) {
      alignedFree(pPVar8);
    }
    else {
      os_free(pPVar8,sVar19 << 5,(this->prims0).alloc.hugepages);
    }
  }
  if (sVar19 != 0) {
    pMVar9 = (this->prims0).alloc.device;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar19 * -0x20,1);
  }
  (this->prims0).size_active = 0;
  (this->prims0).size_alloced = 0;
  (this->prims0).items = (PrimRef *)0x0;
  (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

	/* skip build for empty scene */
        const size_t numOriginalPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(Mesh::geom_type,false);
        numPreviousPrimitives = numOriginalPrimitives;
        if (numOriginalPrimitives == 0) {
          prims0.clear();
          bvh->clear();
          return;
        }

        const unsigned int maxGeomID = mesh ? geomID_ : scene->getMaxGeomID<Mesh,false>();
        const bool usePreSplits = scene->device->useSpatialPreSplits || (maxGeomID >= ((unsigned int)1 << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)));
        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + (usePreSplits ? "BuilderFastSpatialPresplitSAH" : "BuilderFastSpatialSAH"));

        /* create primref array */
        const size_t numSplitPrimitives = max(numOriginalPrimitives,size_t(splitFactor*numOriginalPrimitives));
        prims0.resize(numSplitPrimitives);

        /* enable os_malloc for two level build */
        if (mesh)
          bvh->alloc.setOSallocation(true);
	
	NodeRef root(0);
	PrimInfo pinfo;
	

        if (likely(usePreSplits))
	  {		     
            /* spatial presplit SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray_presplit<Mesh,Splitter>(mesh,maxGeomID,numOriginalPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray_presplit<Mesh,Splitter>(scene,Mesh::geom_type,false,numOriginalPrimitives,prims0,bvh->scene->progressInterface);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeafSpatial<N,Primitive>(bvh),bvh->scene->progressInterface,prims0.data(),pinfo,settings);
	  }
	else
	  {
            /* standard spatial split SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray(mesh,geomID_,numSplitPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray(scene,Mesh::geom_type,false,numSplitPrimitives,prims0,bvh->scene->progressInterface);
	
	    Splitter splitter(scene);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHBuilderBinnedFastSpatialSAH::build<NodeRef>(
								  typename BVH::CreateAlloc(bvh),
								  typename BVH::AABBNode::Create2(),
								  typename BVH::AABBNode::Set2(),
								  CreateLeafSpatial<N,Primitive>(bvh),
								  splitter,
								  bvh->scene->progressInterface,
								  prims0.data(),
								  numSplitPrimitives,
								  pinfo,settings);

	    /* ==================== */
	  }

        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

	/* clear temporary data for static geometry */
	if (scene && scene->isStaticAccel()) {
          prims0.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }